

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb_tests.cpp
# Opt level: O0

void __thiscall
wallet::walletdb_tests::walletdb_read_write_deadlock::test_method
          (walletdb_read_write_deadlock *this)

{
  element_type *peVar1;
  LegacyScriptPubKeyMan *pLVar2;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *legacy_spkm;
  DatabaseFormat *db_format;
  DatabaseFormat *__end2;
  DatabaseFormat *__begin2;
  DatabaseFormat (*__range2) [1];
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> db;
  DatabaseStatus status;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  bilingual_str error_string;
  DatabaseOptions options;
  CWallet *in_stack_fffffffffffffc48;
  lazy_ostream *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  path *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  LegacyDataSPKM *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  LegacyScriptPubKeyMan *in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  bilingual_str *in_stack_fffffffffffffce0;
  DatabaseStatus *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  lazy_ostream *in_stack_fffffffffffffcf8;
  char *local_2c8;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  string *in_stack_fffffffffffffd60;
  Chain *in_stack_fffffffffffffd68;
  CWallet *in_stack_fffffffffffffd70;
  assertion_result local_270 [2];
  const_string local_238;
  lazy_ostream local_218 [2];
  assertion_result local_1f8 [2];
  bilingual_str local_1b1;
  undefined1 local_13c [20];
  undefined8 local_128;
  undefined8 local_4c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_2c8 = "\x01";
      local_2c8 !=
      "N5boost9unit_test17lazy_ostream_implINS0_12lazy_ostreamENS_10test_tools9tt_detail14print_helper_tIN6wallet14DatabaseStatusEEERKS8_EE"
      ; local_2c8 = local_2c8 + 4) {
    DatabaseOptions::DatabaseOptions((DatabaseOptions *)in_stack_fffffffffffffc48);
    std::optional<wallet::DatabaseFormat>::optional<const_wallet::DatabaseFormat_&,_true>
              ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffc58,
               (DatabaseFormat *)in_stack_fffffffffffffc50);
    local_4c = local_128;
    bilingual_str::bilingual_str((bilingual_str *)in_stack_fffffffffffffc48);
    fs::path::path((path *)in_stack_fffffffffffffc48,(path *)0xe6c406);
    tinyformat::format<wallet::DatabaseFormat>
              ((char *)in_stack_fffffffffffffc78,
               (DatabaseFormat *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    fs::operator/(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    MakeDatabase((path *)in_stack_fffffffffffffcf8,
                 (DatabaseOptions *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    fs::path::~path((path *)in_stack_fffffffffffffc48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    fs::path::~path((path *)in_stack_fffffffffffffc48);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc88,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (size_t)in_stack_fffffffffffffc78,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
      in_stack_fffffffffffffcf8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      local_1b1.original.field_2._5_4_ = 0;
      in_stack_fffffffffffffc58 = "DatabaseStatus::SUCCESS";
      in_stack_fffffffffffffc50 = (lazy_ostream *)(local_1b1.original.field_2._M_local_buf + 5);
      in_stack_fffffffffffffc48 = (CWallet *)0x1d2c4c8;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DatabaseStatus,wallet::DatabaseStatus>
                ((undefined1 *)((long)&local_1b1.translated._M_string_length + 1),
                 (undefined1 *)((long)&local_1b1.original.field_2 + 9),0x2a,1,2,local_13c);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffc48);
      in_stack_fffffffffffffcf7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffcf7);
    in_stack_fffffffffffffce8 = (DatabaseStatus *)operator_new(0x4a8);
    std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
              ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
               in_stack_fffffffffffffc48);
    in_stack_fffffffffffffce0 = &local_1b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               in_stack_fffffffffffffc90,(allocator<char> *)in_stack_fffffffffffffc88);
    std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
    unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
               in_stack_fffffffffffffc48,
               (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
               0xe6c65a);
    CWallet::CWallet(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                     (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::shared_ptr<wallet::CWallet>::shared_ptr<wallet::CWallet,void>
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc48,(CWallet *)0xe6c69e);
    std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
    ~unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
                in_stack_fffffffffffffc58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    peVar1 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffc48);
    peVar1->m_keypool_size = 4;
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffc48);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc48);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc88,
               (AnnotatedMixin<std::recursive_mutex> *)
               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               (char *)in_stack_fffffffffffffc78,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc6c,SUB41((uint)in_stack_fffffffffffffc68 >> 0x18,0));
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffc48);
    pLVar2 = CWallet::GetOrCreateLegacyScriptPubKeyMan((CWallet *)in_stack_fffffffffffffc58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc88,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (size_t)in_stack_fffffffffffffc78,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
      (*(pLVar2->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xb])(pLVar2,1);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc58,
                 SUB81((ulong)in_stack_fffffffffffffc50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffc50,(basic_cstring<const_char> *)in_stack_fffffffffffffc48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      in_stack_fffffffffffffc48 = (CWallet *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1f8,local_218,&local_238,0x32,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffc48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc48);
      in_stack_fffffffffffffc9f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffc9f);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffc48);
    CWallet::Flush(in_stack_fffffffffffffc48);
    do {
      in_stack_fffffffffffffc90 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc88,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (size_t)in_stack_fffffffffffffc78,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffffc48);
      in_stack_fffffffffffffc88 =
           CWallet::GetLegacyScriptPubKeyMan
                     ((CWallet *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      in_stack_fffffffffffffc87 = LegacyDataSPKM::DeleteRecords(in_stack_fffffffffffffc78);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc58,
                 SUB81((ulong)in_stack_fffffffffffffc50 >> 0x38,0));
      in_stack_fffffffffffffc78 = (LegacyDataSPKM *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffc50,(basic_cstring<const_char> *)in_stack_fffffffffffffc48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
                 (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
      in_stack_fffffffffffffc48 = (CWallet *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_270,(lazy_ostream *)&stack0xfffffffffffffd70,
                 (const_string *)&stack0xfffffffffffffd50,0x36,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffc48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc48);
      in_stack_fffffffffffffc77 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffc77);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc48);
    std::shared_ptr<wallet::CWallet>::~shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc48);
    std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
    ~unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
                in_stack_fffffffffffffc58);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffc48);
    DatabaseOptions::~DatabaseOptions((DatabaseOptions *)in_stack_fffffffffffffc48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletdb_read_write_deadlock)
{
    // Exercises a db read write operation that shouldn't deadlock.
    for (const DatabaseFormat& db_format : DATABASE_FORMATS) {
        // Context setup
        DatabaseOptions options;
        options.require_format = db_format;
        DatabaseStatus status;
        bilingual_str error_string;
        std::unique_ptr<WalletDatabase> db = MakeDatabase(m_path_root / strprintf("wallet_%d_.dat", db_format).c_str(), options, status, error_string);
        BOOST_CHECK_EQUAL(status, DatabaseStatus::SUCCESS);

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", std::move(db)));
        wallet->m_keypool_size = 4;

        // Create legacy spkm
        LOCK(wallet->cs_wallet);
        auto legacy_spkm = wallet->GetOrCreateLegacyScriptPubKeyMan();
        BOOST_CHECK(legacy_spkm->SetupGeneration(true));
        wallet->Flush();

        // Now delete all records, which performs a read write operation.
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
    }
}